

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool __thiscall Path::isHeader(Path *this)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  Type TVar4;
  size_type sVar5;
  ulong uVar6;
  char *ext;
  
  TVar4 = type(this);
  if (TVar4 != File) {
    return false;
  }
  sVar5 = (this->super_String).mString._M_string_length;
  if (sVar5 == 0) {
    ext = (char *)0x0;
  }
  else {
    pcVar2 = (this->super_String).mString._M_dataplus._M_p;
    ext = (char *)0x0;
    do {
      sVar5 = sVar5 - 1;
      if ((int)(uint)sVar5 < 0) goto LAB_0014f6a7;
      uVar6 = (ulong)((uint)sVar5 & 0x7fffffff);
      cVar1 = pcVar2[uVar6];
      if (cVar1 == '/') goto LAB_0014f6a7;
    } while (cVar1 != '.');
    ext = pcVar2 + uVar6 + 1;
  }
LAB_0014f6a7:
  bVar3 = isHeader(ext);
  return bVar3;
}

Assistant:

bool Path::isHeader() const
{
    return isFile() && isHeader(extension());
}